

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void streamFile(xmllintState *lint,char *filename)

{
  FILE *__stream;
  int iVar1;
  long lVar2;
  xmlStreamCtxtPtr pxVar3;
  int hasSchema;
  xmlError *error;
  xmlTextReaderPtr pxStack_30;
  int ret;
  xmlTextReaderPtr reader;
  FILE *errStream;
  xmlParserInputBufferPtr input;
  char *filename_local;
  xmllintState *lint_local;
  
  errStream = (FILE *)0x0;
  __stream = (FILE *)lint->errStream;
  if (lint->memory == 0) {
    iVar1 = strcmp(filename,"-");
    if (iVar1 == 0) {
      pxStack_30 = (xmlTextReaderPtr)xmlReaderForFd(0,"-",0,lint->options);
    }
    else {
      xmlResetLastError();
      errStream = (FILE *)xmlParserInputBufferCreateFilename(filename,0);
      if (errStream == (FILE *)0x0) {
        lVar2 = xmlGetLastError();
        if ((lVar2 != 0) && (*(int *)(lVar2 + 4) == 2)) {
          lint->progresult = XMLLINT_ERR_MEM;
          return;
        }
        fprintf(__stream,"Unable to open %s\n",filename);
        lint->progresult = XMLLINT_ERR_RDFILE;
        return;
      }
      pxStack_30 = (xmlTextReaderPtr)xmlNewTextReader(errStream,filename);
      if (pxStack_30 == (xmlTextReaderPtr)0x0) {
        lint->progresult = XMLLINT_ERR_MEM;
        xmlFreeParserInputBuffer(errStream);
        return;
      }
      iVar1 = xmlTextReaderSetup(pxStack_30,0,0,0,lint->options);
      if (iVar1 < 0) {
        lint->progresult = XMLLINT_ERR_MEM;
        xmlFreeParserInputBuffer(errStream);
        return;
      }
    }
  }
  else {
    pxStack_30 = (xmlTextReaderPtr)
                 xmlReaderForMemory(lint->memoryData,lint->memorySize & 0xffffffff,filename,0,
                                    lint->options);
  }
  if (pxStack_30 == (xmlTextReaderPtr)0x0) {
    lint->progresult = XMLLINT_ERR_MEM;
  }
  else {
    if (lint->patternc != (xmlPatternPtr)0x0) {
      pxVar3 = (xmlStreamCtxtPtr)xmlPatternGetStreamCtxt(lint->patternc);
      lint->patstream = pxVar3;
      if ((lint->patstream != (xmlStreamCtxtPtr)0x0) &&
         (iVar1 = xmlStreamPush(lint->patstream,0), iVar1 < 0)) {
        fprintf(__stream,"xmlStreamPush() failure\n");
        xmlFreeStreamCtxt(lint->patstream);
        lint->patstream = (xmlStreamCtxtPtr)0x0;
      }
    }
    xmlTextReaderSetResourceLoader(pxStack_30,xmllintResourceLoader,lint);
    if (lint->maxAmpl != 0) {
      xmlTextReaderSetMaxAmplification(pxStack_30,lint->maxAmpl);
    }
    if (lint->relaxng != (char *)0x0) {
      if ((lint->timing != 0) && (lint->repeat == 1)) {
        startTimer(lint);
      }
      iVar1 = xmlTextReaderRelaxNGValidate(pxStack_30,lint->relaxng);
      if (iVar1 < 0) {
        fprintf(__stream,"Relax-NG schema %s failed to compile\n",lint->relaxng);
        lint->progresult = XMLLINT_ERR_SCHEMACOMP;
        lint->relaxng = (char *)0x0;
      }
      if ((lint->timing != 0) && (lint->repeat == 1)) {
        endTimer(lint,"Compiling the schemas");
      }
    }
    if (lint->schema != (char *)0x0) {
      if ((lint->timing != 0) && (lint->repeat == 1)) {
        startTimer(lint);
      }
      iVar1 = xmlTextReaderSchemaValidate(pxStack_30,lint->schema);
      if (iVar1 < 0) {
        fprintf(__stream,"XSD schema %s failed to compile\n",lint->schema);
        lint->progresult = XMLLINT_ERR_SCHEMACOMP;
        lint->schema = (char *)0x0;
      }
      if ((lint->timing != 0) && (lint->repeat == 1)) {
        endTimer(lint,"Compiling the schemas");
      }
    }
    if ((lint->timing != 0) && (lint->repeat == 1)) {
      startTimer(lint);
    }
    error._4_4_ = xmlTextReaderRead(pxStack_30);
    while (error._4_4_ == 1) {
      if ((lint->debug != 0) || (lint->patternc != (xmlPatternPtr)0x0)) {
        processNode(lint,pxStack_30);
      }
      error._4_4_ = xmlTextReaderRead(pxStack_30);
    }
    if ((lint->timing != 0) && (lint->repeat == 1)) {
      if (lint->relaxng == (char *)0x0) {
        if ((lint->options & 0x10U) == 0) {
          endTimer(lint,"Parsing");
        }
        else {
          endTimer(lint,"Parsing and validating");
        }
      }
      else {
        endTimer(lint,"Parsing and validating");
      }
    }
    if (((lint->options & 0x10U) != 0) && (iVar1 = xmlTextReaderIsValid(pxStack_30), iVar1 != 1)) {
      fprintf(__stream,"Document %s does not validate\n",filename);
      lint->progresult = XMLLINT_ERR_VALID;
    }
    if (lint->schema != (char *)0x0 || lint->relaxng != (char *)0x0) {
      iVar1 = xmlTextReaderIsValid(pxStack_30);
      if (iVar1 == 1) {
        if (lint->quiet == 0) {
          fprintf(__stream,"%s validates\n",filename);
        }
      }
      else {
        fprintf(__stream,"%s fails to validate\n",filename);
        lint->progresult = XMLLINT_ERR_VALID;
      }
    }
    xmlFreeTextReader(pxStack_30);
    xmlFreeParserInputBuffer(errStream);
    if (error._4_4_ != 0) {
      fprintf(__stream,"%s : failed to parse\n",filename);
      lint->progresult = XMLLINT_ERR_UNCLASS;
    }
    if (lint->patstream != (xmlStreamCtxtPtr)0x0) {
      xmlFreeStreamCtxt(lint->patstream);
      lint->patstream = (xmlStreamCtxtPtr)0x0;
    }
  }
  return;
}

Assistant:

static void streamFile(xmllintState *lint, const char *filename) {
    xmlParserInputBufferPtr input = NULL;
    FILE *errStream = lint->errStream;
    xmlTextReaderPtr reader;
    int ret;

#if HAVE_DECL_MMAP
    if (lint->memory) {
	reader = xmlReaderForMemory(lint->memoryData, lint->memorySize,
                                    filename, NULL, lint->options);
    } else
#endif
    {
        if (strcmp(filename, "-") == 0) {
            reader = xmlReaderForFd(STDIN_FILENO, "-", NULL, lint->options);
        }
        else {
            /*
             * There's still no easy way to get a reader for a file with
             * adequate error repoting.
             */

            xmlResetLastError();
            input = xmlParserInputBufferCreateFilename(filename,
                                                       XML_CHAR_ENCODING_NONE);
            if (input == NULL) {
                const xmlError *error = xmlGetLastError();

                if ((error != NULL) && (error->code == XML_ERR_NO_MEMORY)) {
                    lint->progresult = XMLLINT_ERR_MEM;
                } else {
                    fprintf(errStream, "Unable to open %s\n", filename);
                    lint->progresult = XMLLINT_ERR_RDFILE;
                }
                return;
            }

            reader = xmlNewTextReader(input, filename);
            if (reader == NULL) {
                lint->progresult = XMLLINT_ERR_MEM;
                xmlFreeParserInputBuffer(input);
                return;
            }
            if (xmlTextReaderSetup(reader, NULL, NULL, NULL,
                                   lint->options) < 0) {
                lint->progresult = XMLLINT_ERR_MEM;
                xmlFreeParserInputBuffer(input);
                return;
            }
        }
    }
    if (reader == NULL) {
        lint->progresult = XMLLINT_ERR_MEM;
        return;
    }

#ifdef LIBXML_PATTERN_ENABLED
    if (lint->patternc != NULL) {
        lint->patstream = xmlPatternGetStreamCtxt(lint->patternc);
	if (lint->patstream != NULL) {
	    ret = xmlStreamPush(lint->patstream, NULL, NULL);
	    if (ret < 0) {
		fprintf(errStream, "xmlStreamPush() failure\n");
		xmlFreeStreamCtxt(lint->patstream);
		lint->patstream = NULL;
            }
	}
    }
#endif


    xmlTextReaderSetResourceLoader(reader, xmllintResourceLoader, lint);
    if (lint->maxAmpl > 0)
        xmlTextReaderSetMaxAmplification(reader, lint->maxAmpl);

#ifdef LIBXML_RELAXNG_ENABLED
    if (lint->relaxng != NULL) {
        if ((lint->timing) && (lint->repeat == 1)) {
            startTimer(lint);
        }
        ret = xmlTextReaderRelaxNGValidate(reader, lint->relaxng);
        if (ret < 0) {
            fprintf(errStream, "Relax-NG schema %s failed to compile\n",
                    lint->relaxng);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            lint->relaxng = NULL;
        }
        if ((lint->timing) && (lint->repeat == 1)) {
            endTimer(lint, "Compiling the schemas");
        }
    }
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
    if (lint->schema != NULL) {
        if ((lint->timing) && (lint->repeat == 1)) {
            startTimer(lint);
        }
        ret = xmlTextReaderSchemaValidate(reader, lint->schema);
        if (ret < 0) {
            fprintf(errStream, "XSD schema %s failed to compile\n",
                    lint->schema);
            lint->progresult = XMLLINT_ERR_SCHEMACOMP;
            lint->schema = NULL;
        }
        if ((lint->timing) && (lint->repeat == 1)) {
            endTimer(lint, "Compiling the schemas");
        }
    }
#endif

    /*
     * Process all nodes in sequence
     */
    if ((lint->timing) && (lint->repeat == 1)) {
        startTimer(lint);
    }
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
        if ((lint->debug)
#ifdef LIBXML_PATTERN_ENABLED
            || (lint->patternc)
#endif
           )
            processNode(lint, reader);
        ret = xmlTextReaderRead(reader);
    }
    if ((lint->timing) && (lint->repeat == 1)) {
#ifdef LIBXML_RELAXNG_ENABLED
        if (lint->relaxng != NULL)
            endTimer(lint, "Parsing and validating");
        else
#endif
#ifdef LIBXML_VALID_ENABLED
        if (lint->options & XML_PARSE_DTDVALID)
            endTimer(lint, "Parsing and validating");
        else
#endif
        endTimer(lint, "Parsing");
    }

#ifdef LIBXML_VALID_ENABLED
    if (lint->options & XML_PARSE_DTDVALID) {
        if (xmlTextReaderIsValid(reader) != 1) {
            fprintf(errStream,
                    "Document %s does not validate\n", filename);
            lint->progresult = XMLLINT_ERR_VALID;
        }
    }
#endif /* LIBXML_VALID_ENABLED */
#if defined(LIBXML_RELAXNG_ENABLED) || defined(LIBXML_SCHEMAS_ENABLED)
    {
        int hasSchema = 0;

#ifdef LIBXML_RELAXNG_ENABLED
        if (lint->relaxng != NULL)
            hasSchema = 1;
#endif
#ifdef LIBXML_SCHEMAS_ENABLED
        if (lint->schema != NULL)
            hasSchema = 1;
#endif
        if (hasSchema) {
            if (xmlTextReaderIsValid(reader) != 1) {
                fprintf(errStream, "%s fails to validate\n", filename);
                lint->progresult = XMLLINT_ERR_VALID;
            } else {
                if (!lint->quiet) {
                    fprintf(errStream, "%s validates\n", filename);
                }
            }
        }
    }
#endif
    /*
     * Done, cleanup and status
     */
    xmlFreeTextReader(reader);
    xmlFreeParserInputBuffer(input);
    if (ret != 0) {
        fprintf(errStream, "%s : failed to parse\n", filename);
        lint->progresult = XMLLINT_ERR_UNCLASS;
    }
#ifdef LIBXML_PATTERN_ENABLED
    if (lint->patstream != NULL) {
	xmlFreeStreamCtxt(lint->patstream);
	lint->patstream = NULL;
    }
#endif
}